

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O0

int stringToInteger(string *str)

{
  byte bVar1;
  void *this;
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [52];
  int local_194;
  istringstream aiStack_190 [4];
  int value;
  istringstream stream;
  string *str_local;
  
  std::__cxx11::istringstream::istringstream(aiStack_190,str,8);
  this = (void *)std::istream::operator>>(aiStack_190,&local_194);
  std::istream::operator>>(this,std::ws<char,std::char_traits<char>>);
  bVar1 = std::ios::fail();
  if (((bVar1 & 1) != 0) || (bVar1 = std::ios::eof(), (bVar1 & 1) == 0)) {
    std::operator+((char *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "stringToInteger: Illegal integer format (");
    std::operator+(local_1c8,(char *)local_1e8);
    error(local_1c8);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string(local_1e8);
  }
  std::__cxx11::istringstream::~istringstream(aiStack_190);
  return local_194;
}

Assistant:

int stringToInteger(string str) {
   istringstream stream(str);
   int value;
   stream >> value >> ws;
   if (stream.fail() || !stream.eof()) {
      error("stringToInteger: Illegal integer format (" + str + ")");
   }
   return value;
}